

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keccak.cpp
# Opt level: O2

void xmrig::keccak(uint8_t *in,int inlen,uint8_t *md,int mdlen)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  ulong uVar3;
  undefined8 local_190;
  uint8_t temp [144];
  state_t st;
  
  iVar2 = 0x88;
  if (mdlen != 200) {
    iVar2 = mdlen * -2 + 200;
  }
  uVar3 = (long)iVar2 / 8 & 0xffffffff;
  local_190 = md;
  memset(st,0,200);
  if ((int)((long)iVar2 / 8) < 1) {
    uVar3 = 0;
  }
  while (iVar2 <= inlen) {
    for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      st[uVar1] = st[uVar1] ^ *(ulong *)(in + uVar1 * 8);
    }
    keccakf(st,0x18);
    in = in + iVar2;
    inlen = inlen - iVar2;
  }
  __n = (size_t)inlen;
  memcpy(temp,in,__n);
  temp[__n] = '\x01';
  memset(temp + __n + 1,0,(long)(~inlen + iVar2));
  temp[(long)iVar2 + -1] = temp[(long)iVar2 + -1] | 0x80;
  for (uVar1 = 0; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    st[uVar1] = st[uVar1] ^ st[uVar1 - 0x12];
  }
  keccakf(st,0x18);
  memcpy(local_190,st,(long)mdlen);
  return;
}

Assistant:

void xmrig::keccak(const uint8_t *in, int inlen, uint8_t *md, int mdlen)
{
    state_t st;
    uint8_t temp[144];
    int i, rsiz, rsizw;

    rsiz = sizeof(state_t) == mdlen ? HASH_DATA_AREA : 200 - 2 * mdlen;
    rsizw = rsiz / 8;
    
    memset(st, 0, sizeof(st));

    for ( ; inlen >= rsiz; inlen -= rsiz, in += rsiz) {
        for (i = 0; i < rsizw; i++) {
            st[i] ^= ((uint64_t *) in)[i];
        }

        xmrig::keccakf(st, KECCAK_ROUNDS);
    }

    // last block and padding
    memcpy(temp, in, inlen);
    temp[inlen++] = 1;
    memset(temp + inlen, 0, rsiz - inlen);
    temp[rsiz - 1] |= 0x80;

    for (i = 0; i < rsizw; i++) {
        st[i] ^= ((uint64_t *) temp)[i];
    }

    keccakf(st, KECCAK_ROUNDS);

    memcpy(md, st, mdlen);
}